

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O2

void __thiscall QTextEdit::focusOutEvent(QTextEdit *this,QFocusEvent *e)

{
  QTextEditPrivate *this_00;
  
  this_00 = *(QTextEditPrivate **)
             &(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  QWidget::focusOutEvent((QWidget *)this,e);
  QTextEditPrivate::sendControlEvent(this_00,(QEvent *)e);
  return;
}

Assistant:

void QTextEdit::focusOutEvent(QFocusEvent *e)
{
    Q_D(QTextEdit);
    QAbstractScrollArea::focusOutEvent(e);
    d->sendControlEvent(e);
}